

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

DIEsForAddress * __thiscall
llvm::DWARFContext::getDIEsForAddress
          (DIEsForAddress *__return_storage_ptr__,DWARFContext *this,uint64_t Address)

{
  bool bVar1;
  Tag TVar2;
  DWARFUnit *this_00;
  reference pvVar3;
  DWARFDie *pDVar4;
  iterator iVar5;
  DWARFDie DVar6;
  undefined1 auStack_a8 [8];
  DWARFDie Child;
  undefined1 local_90 [8];
  iterator __end2;
  iterator __begin2;
  DWARFDie *__range2;
  DWARFDie DIE;
  undefined1 local_48 [8];
  vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> Worklist;
  DWARFDebugInfoEntry *pDStack_28;
  DWARFCompileUnit *CU;
  uint64_t Address_local;
  DWARFContext *this_local;
  
  DIEsForAddress::DIEsForAddress(__return_storage_ptr__);
  this_00 = &getCompileUnitForAddress(this,Address)->super_DWARFUnit;
  if (this_00 != (DWARFUnit *)0x0) {
    __return_storage_ptr__->CompileUnit = (DWARFCompileUnit *)this_00;
    join_0x00000010_0x00000000_ = DWARFUnit::getSubroutineForAddress(this_00,Address);
    (__return_storage_ptr__->FunctionDIE).U =
         (DWARFUnit *)
         Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->FunctionDIE).Die = pDStack_28;
    std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::vector
              ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_48);
    std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
              ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_48,
               &__return_storage_ptr__->FunctionDIE);
    while (bVar1 = std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::empty
                             ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_48),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::back
                         ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_48);
      __range2 = (DWARFDie *)pvVar3->U;
      DIE.U = (DWARFUnit *)pvVar3->Die;
      std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::pop_back
                ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_48);
      bVar1 = DWARFDie::isValid((DWARFDie *)&__range2);
      if (bVar1) {
        TVar2 = DWARFDie::getTag((DWARFDie *)&__range2);
        if ((TVar2 == DW_TAG_lexical_block) &&
           (bVar1 = DWARFDie::addressRangeContainsAddress((DWARFDie *)&__range2,Address), bVar1)) {
          (__return_storage_ptr__->BlockDIE).U = (DWARFUnit *)__range2;
          (__return_storage_ptr__->BlockDIE).Die = (DWARFDebugInfoEntry *)DIE.U;
          break;
        }
        iVar5 = DWARFDie::begin((DWARFDie *)&__range2);
        __end2.Die.Die = (DWARFDebugInfoEntry *)iVar5.Die.U;
        DVar6 = (DWARFDie)DWARFDie::end((DWARFDie *)&__range2);
        while( true ) {
          __end2.Die.U = (DWARFUnit *)DVar6.Die;
          local_90 = (undefined1  [8])DVar6.U;
          bVar1 = llvm::operator!=((iterator *)&__end2.Die.Die,(iterator *)local_90);
          if (!bVar1) break;
          pDVar4 = DWARFDie::iterator::operator*((iterator *)&__end2.Die.Die);
          auStack_a8 = (undefined1  [8])pDVar4->U;
          Child.U = (DWARFUnit *)pDVar4->Die;
          std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::push_back
                    ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_48,
                     (value_type *)auStack_a8);
          DWARFDie::iterator::operator++((iterator *)&__end2.Die.Die);
          DVar6.Die = (DWARFDebugInfoEntry *)__end2.Die.U;
          DVar6.U = (DWARFUnit *)local_90;
        }
      }
    }
    std::vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>::~vector
              ((vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

DWARFContext::DIEsForAddress DWARFContext::getDIEsForAddress(uint64_t Address) {
  DIEsForAddress Result;

  DWARFCompileUnit *CU = getCompileUnitForAddress(Address);
  if (!CU)
    return Result;

  Result.CompileUnit = CU;
  Result.FunctionDIE = CU->getSubroutineForAddress(Address);

  std::vector<DWARFDie> Worklist;
  Worklist.push_back(Result.FunctionDIE);
  while (!Worklist.empty()) {
    DWARFDie DIE = Worklist.back();
    Worklist.pop_back();

    if (!DIE.isValid())
      continue;

    if (DIE.getTag() == DW_TAG_lexical_block &&
        DIE.addressRangeContainsAddress(Address)) {
      Result.BlockDIE = DIE;
      break;
    }

    for (auto Child : DIE)
      Worklist.push_back(Child);
  }

  return Result;
}